

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O3

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible
               (ON_NurbsCurve *nurbs_curveA,ON_NurbsCurve *nurbs_curveB)

{
  ON_Interval *this;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  double *pdVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  int knot_index;
  ON_NurbsCurve *pOVar14;
  ON_NurbsCurve *this_00;
  long lVar15;
  bool bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ON_Interval span;
  ON_Interval local_50;
  ON_Interval local_40;
  
  this_00 = nurbs_curveA;
  pOVar14 = nurbs_curveB;
  if (nurbs_curveB->m_order < nurbs_curveA->m_order) {
    this_00 = nurbs_curveB;
    pOVar14 = nurbs_curveA;
  }
  iVar4 = (*(pOVar14->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x2c])();
  ON_NurbsCurve::IncreaseDegree(this_00,iVar4);
  if (nurbs_curveA->m_order != nurbs_curveB->m_order) {
    return false;
  }
  (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
            (nurbs_curveA);
  (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])
            (nurbs_curveB);
  dVar17 = ON_Interval::Length(&local_50);
  dVar18 = ON_Interval::Length(&local_40);
  pOVar14 = nurbs_curveB;
  this = &local_50;
  if (dVar17 < dVar18) {
    pOVar14 = nurbs_curveA;
    this = &local_40;
  }
  pdVar10 = ON_Interval::operator[](this,0);
  dVar17 = *pdVar10;
  pdVar10 = ON_Interval::operator[](this,1);
  iVar4 = (*(pOVar14->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x26])
                    (dVar17,*pdVar10,pOVar14);
  if ((char)iVar4 == '\0') {
    return false;
  }
  iVar4 = nurbs_curveA->m_order;
  ON_Interval::ON_Interval(&local_50);
  iVar5 = ON_NurbsCurve::KnotCount(nurbs_curveA);
  iVar6 = ON_NurbsCurve::KnotCount(nurbs_curveB);
  iVar7 = (*(nurbs_curveA->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x35])
                    (nurbs_curveA);
  if (((char)iVar7 != '\0') ||
     (iVar7 = (*(nurbs_curveB->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object
                [0x35])(nurbs_curveB), (char)iVar7 != '\0')) {
    bVar3 = true;
    if (2 < iVar4) {
      bVar3 = true;
      uVar13 = 1;
      do {
        if (nurbs_curveA->m_knot[uVar13 - 1] != nurbs_curveB->m_knot[uVar13 - 1]) {
          bVar3 = false;
        }
        if (NAN(nurbs_curveA->m_knot[uVar13 - 1]) || NAN(nurbs_curveB->m_knot[uVar13 - 1])) {
          bVar3 = false;
        }
      } while ((uVar13 < iVar4 - 2) && (uVar13 = uVar13 + 1, bVar3));
    }
    iVar7 = nurbs_curveB->m_cv_count;
    if (iVar7 < iVar6 && nurbs_curveA->m_cv_count < iVar5) {
      lVar15 = (long)nurbs_curveA->m_cv_count;
      while( true ) {
        iVar7 = iVar7 + 1;
        if (!bVar3) break;
        if (nurbs_curveA->m_knot[lVar15] != nurbs_curveB->m_knot[lVar15]) {
          bVar3 = false;
        }
        if (NAN(nurbs_curveA->m_knot[lVar15]) || NAN(nurbs_curveB->m_knot[lVar15])) {
          bVar3 = false;
        }
        if (((long)iVar5 <= lVar15 + 1) || (lVar15 = lVar15 + 1, iVar6 <= iVar7)) break;
      }
    }
    if (bVar3) goto LAB_00548bb8;
  }
  bVar3 = ON_NurbsCurve::ClampEnd(nurbs_curveA,2);
  if (!bVar3) {
    return false;
  }
  bVar3 = ON_NurbsCurve::ClampEnd(nurbs_curveB,2);
  if (!bVar3) {
    return false;
  }
LAB_00548bb8:
  iVar7 = nurbs_curveA->m_cv_count;
  iVar8 = nurbs_curveB->m_cv_count;
  if (iVar4 < iVar8 || iVar4 < iVar7) {
    knot_index = iVar4 + -1;
    iVar6 = (iVar5 - (iVar4 * 2 + -2)) + iVar6;
    while (knot_index < iVar7) {
      pdVar10 = nurbs_curveA->m_knot;
      lVar15 = (long)knot_index;
      dVar17 = pdVar10[lVar15 + -1];
      dVar18 = nurbs_curveB->m_knot[lVar15 + -1];
      if (((dVar17 != dVar18) || (NAN(dVar17) || NAN(dVar18))) || (iVar8 <= knot_index)) break;
      dVar20 = pdVar10[lVar15];
      if ((dVar20 == dVar17) && (!NAN(dVar20) && !NAN(dVar17))) {
        return false;
      }
      dVar17 = nurbs_curveB->m_knot[lVar15];
      if ((dVar17 == dVar18) && (!NAN(dVar17) && !NAN(dVar18))) {
        return false;
      }
      lVar12 = lVar15 + -1;
      iVar5 = ON_KnotMultiplicity(iVar4,iVar7,pdVar10,knot_index);
      iVar7 = ON_KnotMultiplicity(iVar4,nurbs_curveB->m_cv_count,nurbs_curveB->m_knot,knot_index);
      if (dVar17 <= dVar20) {
        if (dVar17 < dVar20) {
          ON_Interval::Set(&local_50,nurbs_curveA->m_knot[lVar12],nurbs_curveA->m_knot[lVar15]);
          dVar19 = ON_Interval::Length(&local_50);
          dVar18 = nurbs_curveA->m_knot[lVar12];
          dVar20 = nurbs_curveA->m_knot[lVar15];
          pdVar10 = ON_Interval::operator[](&local_50,1);
          auVar2 = _DAT_0069b170;
          auVar1 = _DAT_0069b120;
          if ((ABS(dVar20) + ABS(dVar18) + dVar19) * -1.490116119385e-08 + *pdVar10 <= dVar17) {
            pdVar10 = nurbs_curveA->m_knot;
            if (0 < iVar5) {
              lVar12 = (long)(iVar5 + knot_index);
              if ((long)(iVar5 + knot_index) < lVar15 + 1) {
                lVar12 = lVar15 + 1;
              }
              lVar11 = (lVar12 - lVar15) + -1;
              auVar23._8_4_ = (int)lVar11;
              auVar23._0_8_ = lVar11;
              auVar23._12_4_ = (int)((ulong)lVar11 >> 0x20);
              uVar13 = 0;
              do {
                auVar24._8_4_ = (int)uVar13;
                auVar24._0_8_ = uVar13;
                auVar24._12_4_ = (int)(uVar13 >> 0x20);
                auVar21 = auVar23 ^ auVar1;
                auVar24 = (auVar24 | auVar2) ^ auVar1;
                if ((bool)(~(auVar24._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar24._0_4_ ||
                            auVar21._4_4_ < auVar24._4_4_) & 1)) {
                  pdVar10[lVar15 + uVar13] = dVar17;
                }
                if (auVar24._12_4_ <= auVar21._12_4_ &&
                    (auVar24._12_4_ != auVar21._12_4_ || auVar24._8_4_ <= auVar21._8_4_)) {
                  pdVar10[lVar15 + uVar13 + 1] = dVar17;
                }
                uVar13 = uVar13 + 2;
              } while (((lVar12 - lVar15) + 1U & 0xfffffffffffffffe) != uVar13);
            }
          }
          else {
            ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,iVar6);
            ON_NurbsCurve::InsertKnot(nurbs_curveA,dVar17,iVar7);
            pdVar10 = nurbs_curveA->m_knot;
          }
          dVar20 = pdVar10[lVar15];
          iVar5 = ON_KnotMultiplicity(iVar4,nurbs_curveA->m_cv_count,pdVar10,knot_index);
        }
      }
      else {
        ON_Interval::Set(&local_50,nurbs_curveB->m_knot[lVar12],nurbs_curveB->m_knot[lVar15]);
        dVar19 = ON_Interval::Length(&local_50);
        dVar17 = nurbs_curveB->m_knot[lVar12];
        dVar18 = nurbs_curveB->m_knot[lVar15];
        pdVar10 = ON_Interval::operator[](&local_50,1);
        auVar2 = _DAT_0069b170;
        auVar1 = _DAT_0069b120;
        if ((ABS(dVar18) + ABS(dVar17) + dVar19) * -1.490116119385e-08 + *pdVar10 <= dVar20) {
          pdVar10 = nurbs_curveB->m_knot;
          if (0 < iVar7) {
            lVar12 = (long)(iVar7 + knot_index);
            if ((long)(iVar7 + knot_index) < lVar15 + 1) {
              lVar12 = lVar15 + 1;
            }
            lVar11 = (lVar12 - lVar15) + -1;
            auVar21._8_4_ = (int)lVar11;
            auVar21._0_8_ = lVar11;
            auVar21._12_4_ = (int)((ulong)lVar11 >> 0x20);
            auVar21 = auVar21 ^ _DAT_0069b120;
            uVar13 = 0;
            do {
              auVar22._8_4_ = (int)uVar13;
              auVar22._0_8_ = uVar13;
              auVar22._12_4_ = (int)(uVar13 >> 0x20);
              auVar23 = (auVar22 | auVar2) ^ auVar1;
              if ((bool)(~(auVar21._4_4_ < auVar23._4_4_ ||
                          auVar21._0_4_ < auVar23._0_4_ && auVar23._4_4_ == auVar21._4_4_) & 1)) {
                pdVar10[lVar15 + uVar13] = dVar20;
              }
              if (auVar23._12_4_ <= auVar21._12_4_ &&
                  (auVar23._8_4_ <= auVar21._8_4_ || auVar23._12_4_ != auVar21._12_4_)) {
                pdVar10[lVar15 + uVar13 + 1] = dVar20;
              }
              uVar13 = uVar13 + 2;
            } while (((lVar12 - lVar15) + 1U & 0xfffffffffffffffe) != uVar13);
          }
        }
        else {
          ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,iVar6);
          ON_NurbsCurve::InsertKnot(nurbs_curveB,dVar20,iVar5);
          pdVar10 = nurbs_curveB->m_knot;
        }
        dVar17 = pdVar10[lVar15];
        iVar7 = ON_KnotMultiplicity(iVar4,nurbs_curveB->m_cv_count,pdVar10,knot_index);
      }
      if (dVar20 != dVar17) {
        return false;
      }
      if (NAN(dVar20) || NAN(dVar17)) {
        return false;
      }
      if (iVar5 < iVar7) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveA,iVar6);
        bVar3 = ON_NurbsCurve::InsertKnot(nurbs_curveA,dVar20,iVar7);
        iVar5 = iVar7;
LAB_00549045:
        if (bVar3 == false) {
          return false;
        }
      }
      else if (iVar7 < iVar5) {
        ON_NurbsCurve::ReserveKnotCapacity(nurbs_curveB,iVar6);
        bVar3 = ON_NurbsCurve::InsertKnot(nurbs_curveB,dVar20,iVar5);
        goto LAB_00549045;
      }
      knot_index = knot_index + iVar5;
      iVar7 = nurbs_curveA->m_cv_count;
      iVar8 = nurbs_curveB->m_cv_count;
      if (iVar8 + -1 <= knot_index && iVar7 + -1 <= knot_index) break;
    }
  }
  if (iVar7 != iVar8) {
    return false;
  }
  uVar9 = ON_NurbsCurve::KnotCount(nurbs_curveA);
  if (0 < (int)uVar9) {
    lVar15 = 0;
    while( true ) {
      dVar17 = nurbs_curveA->m_knot[lVar15];
      dVar18 = nurbs_curveB->m_knot[lVar15];
      bVar3 = (bool)(-(dVar17 == dVar18) & 1);
      if (dVar17 != dVar18) {
        return bVar3;
      }
      if (NAN(dVar17) || NAN(dVar18)) break;
      bVar16 = (ulong)uVar9 - 1 == lVar15;
      lVar15 = lVar15 + 1;
      if (bVar16) {
        return bVar3;
      }
    }
    return bVar3;
  }
  return true;
}

Assistant:

bool ON_NurbsSurface::ON_Internal_MakeKnotVectorsCompatible(
       ON_NurbsCurve& nurbs_curveA,
       ON_NurbsCurve& nurbs_curveB
       )
{
  if ( !ON_MakeDegreesCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;
  if ( !ON_MakeDomainsCompatible( nurbs_curveA, nurbs_curveB ) )
    return false;

  const int order = nurbs_curveA.m_order;
  ON_Interval span;
  double ktol, a, b;
  int i, ki, multA, multB;
  int knot_countA = nurbs_curveA.KnotCount();
  int knot_countB = nurbs_curveB.KnotCount();
  int max_knot_capacity = knot_countA + knot_countB - 2*(order-1);

  bool bPeriodic = false;
  if ( nurbs_curveA.IsPeriodic() || nurbs_curveB.IsPeriodic() )
  {
    bPeriodic = true;
    for ( ki = 0; ki < order-2 && bPeriodic; ki++ )
    {
      if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
        bPeriodic = false;
    }
    int kiA, kiB;
    for (
      kiA = nurbs_curveA.m_cv_count,
      kiB = nurbs_curveB.m_cv_count;
      kiA < knot_countA && kiB < knot_countB && bPeriodic;
      kiA++, kiB++ )
    {
      if ( nurbs_curveA.m_knot[kiA] != nurbs_curveB.m_knot[kiA] )
        bPeriodic = false;
    }
  }
  if ( !bPeriodic )
  {
    if ( !nurbs_curveA.ClampEnd(2) )
      return false;
    if ( !nurbs_curveB.ClampEnd(2) )
      return false;
  }

  ki = order-1; 
  while ( (ki < nurbs_curveA.m_cv_count-1 || ki < nurbs_curveB.m_cv_count-1)
          && nurbs_curveA.m_knot[ki-1] == nurbs_curveB.m_knot[ki-1]
          && ki <= nurbs_curveA.m_cv_count-1
          && ki <= nurbs_curveB.m_cv_count-1
          )
  {
    a = nurbs_curveA.m_knot[ki];
    if ( a == nurbs_curveA.m_knot[ki-1] )
      return false;
    b = nurbs_curveB.m_knot[ki];
    if ( b == nurbs_curveB.m_knot[ki-1] )
      return false;
    multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );

    if ( a < b )
    {
      // insert a in nurbs_curveB
      span.Set(nurbs_curveB.m_knot[ki-1], nurbs_curveB.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveB.m_knot[ki-1]) + fabs(nurbs_curveB.m_knot[ki]) );
      if ( a >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multB; i++ )
          nurbs_curveB.m_knot[i] = a;          
      }
      else
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveB.InsertKnot( a, multA );
      }
      b = nurbs_curveB.m_knot[ki];
      multB = ON_KnotMultiplicity( order, nurbs_curveB.m_cv_count, nurbs_curveB.m_knot, ki );
    }
    else if ( b < a )
    {
      // insert b in nurbs_curveA
      span.Set(nurbs_curveA.m_knot[ki-1], nurbs_curveA.m_knot[ki] );
      ktol = ON_SQRT_EPSILON*(span.Length() + fabs(nurbs_curveA.m_knot[ki-1]) + fabs(nurbs_curveA.m_knot[ki]) );
      if ( b >= span[1] - ktol )
      {
        for ( i = ki; i < ki+multA; i++ )
          nurbs_curveA.m_knot[i] = b;
      }
      else
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        nurbs_curveA.InsertKnot( b, multB );
      }
      a = nurbs_curveA.m_knot[ki];
      multA = ON_KnotMultiplicity( order, nurbs_curveA.m_cv_count, nurbs_curveA.m_knot, ki );
    }

    if ( a != b )
      return false;

    if ( a == b )
    {
      if ( multA < multB )
      {
        nurbs_curveA.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveA.InsertKnot( a, multB ) )
          return false;
        multA = multB;
      }
      else if ( multB < multA )
      {
        nurbs_curveB.ReserveKnotCapacity( max_knot_capacity );
        if ( !nurbs_curveB.InsertKnot( a, multA ) )
          return false;
        multB = multA;
      }
      ki += multA;
    }
  }

  if ( nurbs_curveA.m_cv_count != nurbs_curveB.m_cv_count )
    return false;
  knot_countA = nurbs_curveA.KnotCount();
  for ( ki = 0; ki < knot_countA; ki++ )
  {
    if ( nurbs_curveA.m_knot[ki] != nurbs_curveB.m_knot[ki] )
      return false;
  }

  return true;
}